

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPacketListener.h
# Opt level: O2

void __thiscall
osc::OscPacketListener::ProcessPacket
          (OscPacketListener *this,char *data,int size,IpEndpointName *remoteEndpoint)

{
  bool bVar1;
  ReceivedPacket p;
  ReceivedPacket local_48;
  ReceivedMessage local_38;
  
  local_48.contents_ = data;
  local_48.size_ = ReceivedPacket::ValidateSize(size);
  bVar1 = ReceivedPacket::IsBundle(&local_48);
  if (bVar1) {
    ReceivedBundle::ReceivedBundle((ReceivedBundle *)&local_38,&local_48);
    (*(this->super_PacketListener)._vptr_PacketListener[3])(this,&local_38,remoteEndpoint);
  }
  else {
    ReceivedMessage::ReceivedMessage(&local_38,&local_48);
    (*(this->super_PacketListener)._vptr_PacketListener[4])(this,&local_38,remoteEndpoint);
  }
  return;
}

Assistant:

virtual void ProcessPacket( const char *data, int size, 
			const IpEndpointName& remoteEndpoint )
    {
        osc::ReceivedPacket p( data, size );
        if( p.IsBundle() )
            ProcessBundle( ReceivedBundle(p), remoteEndpoint );
        else
            ProcessMessage( ReceivedMessage(p), remoteEndpoint );
    }